

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeCubeMap.cpp
# Opt level: O1

void makeCubeMap(EnvmapImage *image1,Header *header,RgbaChannels channels,char *outFileName,
                int tileWidth,int tileHeight,LevelMode levelMode,LevelRoundingMode roundingMode,
                Compression compression,int mapWidth,float filterRadius,int numSamples,bool verbose)

{
  char *__s;
  _Alloc_hider _Var1;
  EnvmapImage *pEVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  Array2D<Imf_3_2::Rgba> *pAVar8;
  long *plVar9;
  ostream *poVar10;
  undefined8 uVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  Compression *pCVar14;
  size_t sVar15;
  NoImplExc *this;
  undefined4 in_register_00000014;
  int tileX;
  EnvmapImage *image2_00;
  int tileY_1;
  Rgba *pRVar16;
  int tileX_1;
  int tileY;
  int iVar17;
  long lVar18;
  allocator<char> local_e9;
  int local_e8;
  int local_e4;
  char *local_e0;
  string name;
  TiledRgbaOutputFile out;
  long local_98 [2];
  undefined8 local_88;
  Box2i faceDw;
  EnvmapImage image2;
  Box2i dw;
  
  local_e0 = (char *)CONCAT44(local_e0._4_4_,filterRadius);
  local_e8 = tileWidth;
  local_e4 = tileHeight;
  pcVar7 = strchr(outFileName,0x25);
  if (pcVar7 == (char *)0x0) {
    if (levelMode == RIPMAP_LEVELS) {
      this = (NoImplExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::NoImplExc::NoImplExc(this,"Cannot generate ripmap cube-face environments.");
      __cxa_throw(this,&Iex_3_2::NoImplExc::typeinfo,Iex_3_2::NoImplExc::~NoImplExc);
    }
    puVar12 = (undefined8 *)Imf_3_2::Header::dataWindow();
    *puVar12 = 0;
    *(int *)(puVar12 + 1) = mapWidth + -1;
    *(int *)((long)puVar12 + 0xc) = mapWidth * 6 + -1;
    puVar12 = (undefined8 *)Imf_3_2::Header::dataWindow();
    puVar13 = (undefined8 *)Imf_3_2::Header::displayWindow();
    *puVar13 = *puVar12;
    puVar13[1] = puVar12[1];
    pCVar14 = (Compression *)Imf_3_2::Header::compression();
    *pCVar14 = compression;
    image2._type = ENVMAP_CUBE;
    Imf_3_2::addEnvmap(header,&image2._type);
    iVar17 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
              ((TiledRgbaOutputFile *)&name,outFileName,header,channels,local_e8,local_e4,levelMode,
               roundingMode,iVar17);
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing file ",0xd);
      if (outFileName == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10e1b8);
      }
      else {
        sVar15 = strlen(outFileName);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,outFileName,sVar15)
        ;
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
    }
    EnvmapImage::EnvmapImage(&image2);
    iVar17 = 0;
    pEVar2 = &image2;
    while( true ) {
      image2_00 = pEVar2;
      iVar3 = Imf_3_2::TiledRgbaOutputFile::numLevels();
      if (iVar3 <= iVar17) break;
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"level ",6);
        plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar17);
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
      }
      Imf_3_2::TiledRgbaOutputFile::dataWindowForLevel((int)&out);
      resizeCube(image1,image2_00,(Box2i *)&out,local_e0._0_4_,numSamples);
      pAVar8 = EnvmapImage::pixels(image2_00);
      Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&name,(ulong)pAVar8->_data,1);
      iVar3 = 0;
      while( true ) {
        iVar4 = (int)&name;
        iVar5 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar4);
        if (iVar5 <= iVar3) break;
        iVar5 = 0;
        while( true ) {
          iVar6 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar4);
          if (iVar6 <= iVar5) break;
          Imf_3_2::TiledRgbaOutputFile::writeTile(iVar4,iVar5,iVar3);
          iVar5 = iVar5 + 1;
        }
        iVar3 = iVar3 + 1;
      }
      iVar17 = iVar17 + 1;
      pEVar2 = image1;
      image1 = image2_00;
    }
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
    }
    if (image2._pixels._data != (Rgba *)0x0) {
      operator_delete__(image2._pixels._data);
    }
    Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&name);
  }
  else {
    faceDw.max.x = mapWidth + -1;
    dw.max.y = mapWidth * 6 + -1;
    dw.min.x = 0;
    dw.min.y = 0;
    faceDw.min.x = 0;
    faceDw.min.y = 0;
    faceDw.max.y = faceDw.max.x;
    dw.max.x = faceDw.max.x;
    EnvmapImage::EnvmapImage(&image2);
    resizeCube(image1,&image2,&dw,local_e0._0_4_,numSamples);
    pAVar8 = EnvmapImage::pixels(&image2);
    pRVar16 = pAVar8->_data;
    lVar18 = 0;
    local_e0 = outFileName;
    do {
      std::__cxx11::string::string<std::allocator<char>>((string *)&out,local_e0,&local_e9);
      __s = (&(anonymous_namespace)::
              makeCubeMapSixFiles(EnvmapImage&,Imf_3_2::Header&,Imf_3_2::RgbaChannels,char_const*,int,int,Imf_3_2::Compression,int,float,int,bool)
              ::faceNames)[lVar18];
      strlen(__s);
      plVar9 = (long *)std::__cxx11::string::replace
                                 ((ulong)&out,(long)pcVar7 - (long)outFileName,(char *)0x1,
                                  (ulong)__s);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&name,*plVar9,plVar9[1] + *plVar9);
      if (_out != (Rgba)local_98) {
        operator_delete((void *)_out,local_98[0] + 1);
      }
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"writing file ",0xd);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,name._M_dataplus._M_p,name._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      _Var1._M_p = name._M_dataplus._M_p;
      local_88 = 0;
      uVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
                ((TiledRgbaOutputFile *)0x3f800000,0x3f800000,(Rgba *)&out,_Var1._M_p,local_e8,
                 local_e4,0,0,&faceDw,&faceDw,CONCAT44(in_register_00000014,channels),&local_88,0,
                 compression,uVar11);
      Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pRVar16,1);
      iVar17 = 0;
      while( true ) {
        iVar5 = (int)(Rgba *)&out;
        iVar3 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar5);
        if (iVar3 <= iVar17) break;
        iVar3 = 0;
        while( true ) {
          iVar4 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar5);
          if (iVar4 <= iVar3) break;
          Imf_3_2::TiledRgbaOutputFile::writeTile(iVar5,iVar3,iVar17);
          iVar3 = iVar3 + 1;
        }
        iVar17 = iVar17 + 1;
      }
      Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      pRVar16 = pRVar16 + (uint)(mapWidth * mapWidth);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 6);
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
    }
    if (image2._pixels._data != (Rgba *)0x0) {
      operator_delete__(image2._pixels._data);
    }
  }
  return;
}

Assistant:

void
makeCubeMap (
    EnvmapImage&      image1,
    Header&           header,
    RgbaChannels      channels,
    const char        outFileName[],
    int               tileWidth,
    int               tileHeight,
    LevelMode         levelMode,
    LevelRoundingMode roundingMode,
    Compression       compression,
    int               mapWidth,
    float             filterRadius,
    int               numSamples,
    bool              verbose)
{
    if (strchr (outFileName, '%'))
    {
        makeCubeMapSixFiles (
            image1,
            header,
            channels,
            outFileName,
            tileWidth,
            tileHeight,
            compression,
            mapWidth,
            filterRadius,
            numSamples,
            verbose);
    }
    else
    {
        makeCubeMapSingleFile (
            image1,
            header,
            channels,
            outFileName,
            tileWidth,
            tileHeight,
            levelMode,
            roundingMode,
            compression,
            mapWidth,
            filterRadius,
            numSamples,
            verbose);
    }
}